

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.h
# Opt level: O2

void __thiscall chrono::curiosity::CuriosityPart::~CuriosityPart(CuriosityPart *this)

{
  this->_vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_001a08d8;
  std::__cxx11::string::~string((string *)&this->m_mesh_name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual ~CuriosityPart() {}